

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.h
# Opt level: O0

uint Security::GetByteCount<long>(long value)

{
  bool bVar1;
  undefined4 local_18;
  undefined4 local_14;
  uint i;
  uint byteCount;
  long value_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    bVar1 = IsByteSet<long>(value,local_18);
    if (bVar1) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

static uint GetByteCount(T value)
    {
        uint byteCount = 0;
        for (uint i = 0; i < sizeof(T); ++i)
        {
            if (IsByteSet(value, i))
            {
                ++byteCount;
            }
        }
        return byteCount;
    }